

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void __thiscall
pfederc::TraitExpr::TraitExpr
          (TraitExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps,
          Token *tokId,TemplateDecls *templs,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *impltraits,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  size_t sVar1;
  pointer puVar2;
  pointer puVar3;
  
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_TRAIT;
  sVar1 = pos->startIndex;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = sVar1;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Capable).caps._M_t.
  super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
  super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl =
       (caps->_M_t).
       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>.
       _M_t.
       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
       super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
  (caps->_M_t).
  super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
  super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl = (Capabilities *)0x0;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__TraitExpr_00128808;
  this->tokId = tokId;
  puVar2 = (templs->
           super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->templs).
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (templs->
       super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->templs).
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  (this->templs).
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (templs->
       super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (templs->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (templs->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (templs->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (impltraits->
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->impltraits).
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (impltraits->
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->impltraits).
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  (this->impltraits).
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (impltraits->
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (impltraits->
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (impltraits->
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (impltraits->
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->functions,(_List_node_header *)functions);
  if (this->tokId != (Token *)0x0) {
    _setTemplateParents(&this->templs,&this->super_Expr);
    _setParents<pfederc::Expr>(&this->impltraits,&this->super_Expr);
    _setParents<pfederc::FuncExpr>(&this->functions,&this->super_Expr);
    return;
  }
  __assert_fail("this->tokId",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x14f,
                "pfederc::TraitExpr::TraitExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, TemplateDecls &&, std::vector<std::unique_ptr<Expr>> &&, std::list<std::unique_ptr<FuncExpr>> &&)"
               );
}

Assistant:

TraitExpr::TraitExpr(const Lexer &lexer, const Position &pos,
    std::unique_ptr<Capabilities> &&caps,
    const Token *tokId,
    TemplateDecls &&templs,
    std::vector<std::unique_ptr<Expr>> &&impltraits,
    std::list<std::unique_ptr<FuncExpr>> &&functions) noexcept
    : Expr(lexer, ExprType::EXPR_TRAIT, pos), Capable(std::move(caps)), tokId{tokId},
      templs(std::move(templs)),
      impltraits(std::move(impltraits)), functions(std::move(functions)) {
  assert(this->tokId);

  _setTemplateParents(this->templs, this);
  _setParents(this->impltraits, this);
  _setParents(this->functions, this);
}